

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int __thiscall DLevelScript::GetActorProperty(DLevelScript *this,int tid,int property)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  AActor *pAVar4;
  char *pcVar5;
  uint local_68;
  uint local_64;
  FName local_54;
  TFlags<ActorFlag2,_unsigned_int> local_50;
  TFlags<ActorFlag6,_unsigned_int> local_4c;
  TFlags<ActorFlag3,_unsigned_int> local_48;
  TFlags<ActorFlag,_unsigned_int> local_44;
  TFlags<ActorFlag4,_unsigned_int> local_40;
  TFlags<ActorFlag5,_unsigned_int> local_3c;
  TFlags<ActorFlag,_unsigned_int> local_38;
  TFlags<ActorFlag,_unsigned_int> local_34;
  TFlags<ActorFlag2,_unsigned_int> local_30;
  int local_2c;
  AActor *pAStack_28;
  int style;
  AActor *actor;
  int property_local;
  int tid_local;
  DLevelScript *this_local;
  
  actor._0_4_ = property;
  actor._4_4_ = tid;
  _property_local = this;
  pAVar4 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->activator);
  pAStack_28 = SingleActorFromTID(tid,pAVar4);
  if (pAStack_28 == (AActor *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    iVar1 = (int)pAStack_28;
    switch((int)actor) {
    case 0:
      this_local._4_4_ = pAStack_28->health;
      break;
    case 1:
      this_local._4_4_ = DoubleToACS(pAStack_28->Speed);
      break;
    case 2:
      this_local._4_4_ =
           (*(pAStack_28->super_DThinker).super_DObject._vptr_DObject[0x23])(pAStack_28,0,1);
      break;
    case 3:
      this_local._4_4_ = DoubleToACS(pAStack_28->Alpha);
      break;
    case 4:
      for (local_2c = 0; local_2c < 0xe; local_2c = local_2c + 1) {
        bVar2 = FRenderStyle::operator==
                          ((FRenderStyle *)&LegacyRenderStyles[local_2c].field_0,
                           &pAStack_28->RenderStyle);
        if (bVar2) {
          return LegacyRenderStyleIndices[local_2c];
        }
      }
      this_local._4_4_ = 1;
      break;
    case 5:
      pcVar5 = FSoundID::operator_cast_to_char_(&(pAStack_28->SeeSound).super_FSoundID);
      this_local._4_4_ = ACSStringPool::AddString(&GlobalACSStrings,pcVar5);
      break;
    case 6:
      pcVar5 = FSoundID::operator_cast_to_char_(&(pAStack_28->AttackSound).super_FSoundID);
      this_local._4_4_ = ACSStringPool::AddString(&GlobalACSStrings,pcVar5);
      break;
    case 7:
      pcVar5 = FSoundID::operator_cast_to_char_(&(pAStack_28->PainSound).super_FSoundID);
      this_local._4_4_ = ACSStringPool::AddString(&GlobalACSStrings,pcVar5);
      break;
    case 8:
      pcVar5 = FSoundID::operator_cast_to_char_(&(pAStack_28->DeathSound).super_FSoundID);
      this_local._4_4_ = ACSStringPool::AddString(&GlobalACSStrings,pcVar5);
      break;
    case 9:
      pcVar5 = FSoundID::operator_cast_to_char_(&(pAStack_28->ActiveSound).super_FSoundID);
      this_local._4_4_ = ACSStringPool::AddString(&GlobalACSStrings,pcVar5);
      break;
    case 10:
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_34,iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
      uVar3 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_34);
      this_local._4_4_ = (uint)(uVar3 != 0);
      break;
    case 0xb:
      TFlags<ActorFlag2,_unsigned_int>::operator&
                (&local_30,iVar1 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
      uVar3 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_30);
      this_local._4_4_ = (uint)(uVar3 != 0);
      break;
    case 0xc:
      bVar2 = DObject::IsKindOf((DObject *)pAStack_28,APlayerPawn::RegistrationInfo.MyClass);
      if (bVar2) {
        this_local._4_4_ =
             DoubleToACS(*(double *)&pAStack_28[1].super_DThinker.super_DObject.ObjectFlags);
      }
      else {
        this_local._4_4_ = 0;
      }
      break;
    case 0xd:
      TFlags<ActorFlag5,_unsigned_int>::operator&
                (&local_3c,
                 iVar1 + (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_COUNTSECRET|MF5_NOFORWARDFALL|
                         MF5_NODROPOFF));
      uVar3 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_3c);
      this_local._4_4_ = (uint)(uVar3 != 0);
      break;
    case 0xe:
      TFlags<ActorFlag4,_unsigned_int>::operator&
                (&local_40,iVar1 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH))
      ;
      uVar3 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_40);
      this_local._4_4_ = (uint)(uVar3 != 0);
      break;
    case 0xf:
      this_local._4_4_ = DoubleToACS(pAStack_28->Gravity);
      break;
    case 0x10:
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_44,iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
      uVar3 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_44);
      this_local._4_4_ = (uint)(uVar3 != 0);
      break;
    case 0x11:
      bVar2 = DObject::IsKindOf((DObject *)pAStack_28,APlayerPawn::RegistrationInfo.MyClass);
      if (bVar2) {
        this_local._4_4_ = *(uint *)&pAStack_28[1].super_DThinker.super_DObject._vptr_DObject;
      }
      else {
        this_local._4_4_ = AActor::SpawnHealth(pAStack_28);
      }
      break;
    case 0x12:
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_38,iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
      uVar3 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_38);
      this_local._4_4_ = (uint)(uVar3 != 0);
      break;
    case 0x13:
      TFlags<ActorFlag3,_unsigned_int>::operator&
                (&local_48,iVar1 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG)
                );
      uVar3 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_48);
      this_local._4_4_ = (uint)(uVar3 != 0);
      break;
    case 0x14:
      (*(pAStack_28->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_54);
      pcVar5 = FName::operator_cast_to_char_(&local_54);
      this_local._4_4_ = ACSStringPool::AddString(&GlobalACSStrings,pcVar5);
      break;
    case 0x15:
      pcVar5 = AActor::GetTag(pAStack_28,(char *)0x0);
      this_local._4_4_ = ACSStringPool::AddString(&GlobalACSStrings,pcVar5);
      break;
    case 0x16:
      this_local._4_4_ = pAStack_28->Score;
      break;
    case 0x17:
      TFlags<ActorFlag6,_unsigned_int>::operator&
                (&local_4c,iVar1 + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_BUMPSPECIAL));
      uVar3 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_4c);
      this_local._4_4_ = (uint)(uVar3 != 0);
      break;
    case 0x18:
      this_local._4_4_ = DoubleToACS(pAStack_28->DamageFactor);
      break;
    case 0x19:
      this_local._4_4_ = DoGetMasterTID(pAStack_28);
      break;
    case 0x1a:
      bVar2 = TObjPtr<AActor>::operator!=(&pAStack_28->target,(AActor *)0x0);
      if (bVar2) {
        pAVar4 = TObjPtr<AActor>::operator->(&pAStack_28->target);
        local_64 = pAVar4->tid;
      }
      else {
        local_64 = 0;
      }
      this_local._4_4_ = local_64;
      break;
    case 0x1b:
      bVar2 = TObjPtr<AActor>::operator!=(&pAStack_28->tracer,(AActor *)0x0);
      if (bVar2) {
        pAVar4 = TObjPtr<AActor>::operator->(&pAStack_28->tracer);
        local_68 = pAVar4->tid;
      }
      else {
        local_68 = 0;
      }
      this_local._4_4_ = local_68;
      break;
    case 0x1c:
      this_local._4_4_ = pAStack_28->waterlevel;
      break;
    case 0x1d:
      this_local._4_4_ = DoubleToACS((pAStack_28->Scale).X);
      break;
    case 0x1e:
      this_local._4_4_ = DoubleToACS((pAStack_28->Scale).Y);
      break;
    case 0x1f:
      TFlags<ActorFlag2,_unsigned_int>::operator&
                (&local_50,iVar1 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
      uVar3 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_50);
      this_local._4_4_ = (uint)(uVar3 != 0);
      break;
    case 0x20:
      this_local._4_4_ = pAStack_28->Mass;
      break;
    case 0x21:
      this_local._4_4_ = pAStack_28->accuracy;
      break;
    case 0x22:
      this_local._4_4_ = pAStack_28->stamina;
      break;
    case 0x23:
      this_local._4_4_ = DoubleToACS(pAStack_28->Height);
      break;
    case 0x24:
      this_local._4_4_ = DoubleToACS(pAStack_28->radius);
      break;
    case 0x25:
      this_local._4_4_ = pAStack_28->reactiontime;
      break;
    case 0x26:
      this_local._4_4_ = DoubleToACS(pAStack_28->meleerange);
      break;
    case 0x27:
      bVar2 = DObject::IsKindOf((DObject *)pAStack_28,APlayerPawn::RegistrationInfo.MyClass);
      if (bVar2) {
        this_local._4_4_ = DoubleToACS((double)pAStack_28[1].sprev);
      }
      else {
        this_local._4_4_ = 0;
      }
      break;
    case 0x28:
      bVar2 = DObject::IsKindOf((DObject *)pAStack_28,APlayerPawn::RegistrationInfo.MyClass);
      if (bVar2) {
        this_local._4_4_ = DoubleToACS(pAStack_28[1].SpriteAngle.Degrees);
      }
      else {
        this_local._4_4_ = 0;
      }
      break;
    case 0x29:
      this_local._4_4_ = pAStack_28->fillcolor;
      break;
    case 0x2a:
      this_local._4_4_ = DoubleToACS(pAStack_28->Friction);
      break;
    case 0x2b:
      this_local._4_4_ = DoubleToACS(pAStack_28->DamageMultiply);
      break;
    case 0x2c:
      this_local._4_4_ = DoubleToACS(pAStack_28->MaxStepHeight);
      break;
    case 0x2d:
      this_local._4_4_ = DoubleToACS(pAStack_28->MaxDropOffHeight);
      break;
    case 0x2e:
      pcVar5 = FName::operator_cast_to_char_(&(pAStack_28->DamageType).super_FName);
      this_local._4_4_ = ACSStringPool::AddString(&GlobalACSStrings,pcVar5);
      break;
    default:
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int DLevelScript::GetActorProperty (int tid, int property)
{
	AActor *actor = SingleActorFromTID (tid, activator);

	if (actor == NULL)
	{
		return 0;
	}
	switch (property)
	{
	case APROP_Health:		return actor->health;
	case APROP_Speed:		return DoubleToACS(actor->Speed);
	case APROP_Damage:		return actor->GetMissileDamage(0,1);
	case APROP_DamageFactor:return DoubleToACS(actor->DamageFactor);
	case APROP_DamageMultiplier: return DoubleToACS(actor->DamageMultiply);
	case APROP_Alpha:		return DoubleToACS(actor->Alpha);
	case APROP_RenderStyle:	for (int style = STYLE_None; style < STYLE_Count; ++style)
							{ // Check for a legacy render style that matches.
								if (LegacyRenderStyles[style] == actor->RenderStyle)
								{
									return LegacyRenderStyleIndices[style];
								}
							}
							// The current render style isn't expressable as a legacy style,
							// so pretends it's normal.
							return STYLE_Normal;
	case APROP_Gravity:		return DoubleToACS(actor->Gravity);
	case APROP_Invulnerable:return !!(actor->flags2 & MF2_INVULNERABLE);
	case APROP_Ambush:		return !!(actor->flags & MF_AMBUSH);
	case APROP_Dropped:		return !!(actor->flags & MF_DROPPED);
	case APROP_ChaseGoal:	return !!(actor->flags5 & MF5_CHASEGOAL);
	case APROP_Frightened:	return !!(actor->flags4 & MF4_FRIGHTENED);
	case APROP_Friendly:	return !!(actor->flags & MF_FRIENDLY);
	case APROP_Notarget:	return !!(actor->flags3 & MF3_NOTARGET);
	case APROP_Notrigger:	return !!(actor->flags6 & MF6_NOTRIGGER);
	case APROP_Dormant:		return !!(actor->flags2 & MF2_DORMANT);
	case APROP_SpawnHealth: if (actor->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
							{
								return static_cast<APlayerPawn *>(actor)->MaxHealth;
							}
							else
							{
								return actor->SpawnHealth();
							}

	case APROP_JumpZ:		if (actor->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
							{
								return DoubleToACS(static_cast<APlayerPawn *>(actor)->JumpZ);	// [GRB]
							}
							else
							{
								return 0;
							}
	case APROP_Score:		return actor->Score;
	case APROP_MasterTID:	return DoGetMasterTID (actor);
	case APROP_TargetTID:	return (actor->target != NULL)? actor->target->tid : 0;
	case APROP_TracerTID:	return (actor->tracer != NULL)? actor->tracer->tid : 0;
	case APROP_WaterLevel:	return actor->waterlevel;
	case APROP_ScaleX: 		return DoubleToACS(actor->Scale.X);
	case APROP_ScaleY: 		return DoubleToACS(actor->Scale.Y);
	case APROP_Mass: 		return actor->Mass;
	case APROP_Accuracy:    return actor->accuracy;
	case APROP_Stamina:     return actor->stamina;
	case APROP_Height:		return DoubleToACS(actor->Height);
	case APROP_Radius:		return DoubleToACS(actor->radius);
	case APROP_ReactionTime:return actor->reactiontime;
	case APROP_MeleeRange:	return DoubleToACS(actor->meleerange);
	case APROP_ViewHeight:	if (actor->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
							{
								return DoubleToACS(static_cast<APlayerPawn *>(actor)->ViewHeight);
							}
							else
							{
								return 0;
							}
	case APROP_AttackZOffset:
							if (actor->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
							{
								return DoubleToACS(static_cast<APlayerPawn *>(actor)->AttackZOffset);
							}
							else
							{
								return 0;
							}

	case APROP_SeeSound:	return GlobalACSStrings.AddString(actor->SeeSound);
	case APROP_AttackSound:	return GlobalACSStrings.AddString(actor->AttackSound);
	case APROP_PainSound:	return GlobalACSStrings.AddString(actor->PainSound);
	case APROP_DeathSound:	return GlobalACSStrings.AddString(actor->DeathSound);
	case APROP_ActiveSound:	return GlobalACSStrings.AddString(actor->ActiveSound);
	case APROP_Species:		return GlobalACSStrings.AddString(actor->GetSpecies());
	case APROP_NameTag:		return GlobalACSStrings.AddString(actor->GetTag());
	case APROP_StencilColor:return actor->fillcolor;
	case APROP_Friction:	return DoubleToACS(actor->Friction);
	case APROP_MaxStepHeight: return DoubleToACS(actor->MaxStepHeight);
	case APROP_MaxDropOffHeight: return DoubleToACS(actor->MaxDropOffHeight);
	case APROP_DamageType:	return GlobalACSStrings.AddString(actor->DamageType);

	default:				return 0;
	}
}